

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::FieldDef::Deserialize(FieldDef *this,Parser *parser,Field *field)

{
  Field *pFVar1;
  bool bVar2;
  bool required;
  uint16_t uVar3;
  Presence PVar4;
  String *this_00;
  Type *type;
  int64_t t;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Value *pVVar5;
  StructDef *pSVar6;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  double t_00;
  allocator<char> local_139;
  string local_138;
  uint local_114;
  undefined1 local_110 [8];
  string nested_qualified_name;
  string local_e8;
  Value *local_c8;
  Value *nested;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  Field *local_28;
  Field *field_local;
  Parser *parser_local;
  FieldDef *this_local;
  
  local_28 = field;
  field_local = (Field *)parser;
  parser_local = (Parser *)this;
  this_00 = reflection::Field::name(field);
  String::str_abi_cxx11_(&local_48,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pFVar1 = field_local;
  (this->super_Definition).defined_namespace = *(Namespace **)(field_local + 0x198);
  type = reflection::Field::type(local_28);
  bVar2 = Type::Deserialize(&(this->value).type,(Parser *)pFVar1,type);
  if (bVar2) {
    uVar3 = reflection::Field::offset(local_28);
    (this->value).offset = uVar3;
    bVar2 = IsInteger((this->value).type.base_type);
    if (bVar2) {
      t = reflection::Field::default_integer(local_28);
      NumToString<long>(&local_68,t);
      std::__cxx11::string::operator=((string *)&(this->value).constant,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      bVar2 = IsFloat((this->value).type.base_type);
      if (bVar2) {
        t_00 = reflection::Field::default_real(local_28);
        FloatToString<double>(&local_88,t_00,0x11);
        std::__cxx11::string::operator=((string *)&(this->value).constant,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    bVar2 = reflection::Field::optional(local_28);
    required = reflection::Field::required(local_28);
    PVar4 = MakeFieldPresence(bVar2,required);
    this->presence = PVar4;
    uVar3 = reflection::Field::padding(local_28);
    this->padding = (ulong)uVar3;
    bVar2 = reflection::Field::key(local_28);
    this->key = bVar2;
    bVar2 = reflection::Field::offset64(local_28);
    pFVar1 = field_local;
    this->offset64 = bVar2;
    attrs = reflection::Field::attributes(local_28);
    bVar2 = Definition::DeserializeAttributes(&this->super_Definition,(Parser *)pFVar1,attrs);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"flexbuffer",&local_a9)
      ;
      pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(this->super_Definition).attributes,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      if (pVVar5 != (Value *)0x0) {
        this->flexbuffer = true;
        field_local[0x6f8].super_Table = (Table)0x1;
        if (((this->value).type.base_type != BASE_TYPE_VECTOR) ||
           ((this->value).type.element != BASE_TYPE_UCHAR)) {
          this_local._7_1_ = 0;
          goto LAB_001354bf;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"nested_flatbuffer",
                 (allocator<char> *)(nested_qualified_name.field_2._M_local_buf + 0xf));
      pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(this->super_Definition).attributes,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(nested_qualified_name.field_2._M_local_buf + 0xf));
      local_c8 = pVVar5;
      if (pVVar5 != (Value *)0x0) {
        Namespace::GetFullyQualifiedName
                  ((string *)local_110,*(Namespace **)(field_local + 0x198),&pVVar5->constant,1000);
        pSVar6 = Parser::LookupStruct((Parser *)field_local,(string *)local_110);
        this->nested_flatbuffer = pSVar6;
        bVar2 = this->nested_flatbuffer == (StructDef *)0x0;
        if (bVar2) {
          this_local._7_1_ = 0;
        }
        local_114 = (uint)bVar2;
        std::__cxx11::string::~string((string *)local_110);
        if (local_114 != 0) goto LAB_001354bf;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"shared",&local_139);
      pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(this->super_Definition).attributes,&local_138);
      this->shared = pVVar5 != (Value *)0x0;
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      documentation = reflection::Field::documentation(local_28);
      anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001354bf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FieldDef::Deserialize(Parser &parser, const reflection::Field *field) {
  name = field->name()->str();
  defined_namespace = parser.current_namespace_;
  if (!value.type.Deserialize(parser, field->type())) return false;
  value.offset = field->offset();
  if (IsInteger(value.type.base_type)) {
    value.constant = NumToString(field->default_integer());
  } else if (IsFloat(value.type.base_type)) {
    value.constant = FloatToString(field->default_real(), 17);
  }
  presence = FieldDef::MakeFieldPresence(field->optional(), field->required());
  padding = field->padding();
  key = field->key();
  offset64 = field->offset64();
  if (!DeserializeAttributes(parser, field->attributes())) return false;
  // TODO: this should probably be handled by a separate attribute
  if (attributes.Lookup("flexbuffer")) {
    flexbuffer = true;
    parser.uses_flexbuffers_ = true;
    if (value.type.base_type != BASE_TYPE_VECTOR ||
        value.type.element != BASE_TYPE_UCHAR)
      return false;
  }
  if (auto nested = attributes.Lookup("nested_flatbuffer")) {
    auto nested_qualified_name =
        parser.current_namespace_->GetFullyQualifiedName(nested->constant);
    nested_flatbuffer = parser.LookupStruct(nested_qualified_name);
    if (!nested_flatbuffer) return false;
  }
  shared = attributes.Lookup("shared") != nullptr;
  DeserializeDoc(doc_comment, field->documentation());
  return true;
}